

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getTypeInfoFromNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *localPart)

{
  XMLBuffer *this_00;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *this_01;
  XMLCh *key;
  int iVar1;
  Grammar *pGVar2;
  ComplexTypeInfo *pCVar3;
  
  pGVar2 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if (pGVar2 != (Grammar *)0x0) {
    iVar1 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[5])(pGVar2);
    if (iVar1 == 1) {
      this_00 = &this->fBuffer;
      XMLBuffer::set(this_00,uriStr);
      XMLBuffer::append(this_00,L',');
      XMLBuffer::append(this_00,localPart);
      this_01 = (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
                pGVar2[7].super_XSerializable._vptr_XSerializable;
      key = (this->fBuffer).fBuffer;
      key[(this->fBuffer).fIndex] = L'\0';
      pCVar3 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                         (this_01,key);
      return pCVar3;
    }
  }
  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,uriStr,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
  return (ComplexTypeInfo *)0x0;
}

Assistant:

ComplexTypeInfo* TraverseSchema::getTypeInfoFromNS(const DOMElement* const elem,
                                                   const XMLCh* const uriStr,
                                                   const XMLCh* const localPart)
{

    Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

    if (grammar != 0 && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        ComplexTypeInfo* typeInfo =
            ((SchemaGrammar*)grammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        return typeInfo;
    }
    else {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
    }

    return 0;
}